

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

void __thiscall ON_Xform::ON_Xform(ON_Xform *this,float *m)

{
  float *m_local;
  ON_Xform *this_local;
  
  this->m_xform[0][0] = (double)*m;
  this->m_xform[0][1] = (double)m[1];
  this->m_xform[0][2] = (double)m[2];
  this->m_xform[0][3] = (double)m[3];
  this->m_xform[1][0] = (double)m[4];
  this->m_xform[1][1] = (double)m[5];
  this->m_xform[1][2] = (double)m[6];
  this->m_xform[1][3] = (double)m[7];
  this->m_xform[2][0] = (double)m[8];
  this->m_xform[2][1] = (double)m[9];
  this->m_xform[2][2] = (double)m[10];
  this->m_xform[2][3] = (double)m[0xb];
  this->m_xform[3][0] = (double)m[0xc];
  this->m_xform[3][1] = (double)m[0xd];
  this->m_xform[3][2] = (double)m[0xe];
  this->m_xform[3][3] = (double)m[0xf];
  return;
}

Assistant:

ON_Xform::ON_Xform( const float* m )
{
  m_xform[0][0] = (double)m[0];
  m_xform[0][1] = (double)m[1];
  m_xform[0][2] = (double)m[2];
  m_xform[0][3] = (double)m[3];

  m_xform[1][0] = (double)m[4];
  m_xform[1][1] = (double)m[5];
  m_xform[1][2] = (double)m[6];
  m_xform[1][3] = (double)m[7];

  m_xform[2][0] = (double)m[8];
  m_xform[2][1] = (double)m[9];
  m_xform[2][2] = (double)m[10];
  m_xform[2][3] = (double)m[11];

  m_xform[3][0] = (double)m[12];
  m_xform[3][1] = (double)m[13];
  m_xform[3][2] = (double)m[14];
  m_xform[3][3] = (double)m[15];
}